

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O2

void time_to_scetime(time_t *time,SceDateTime *sce)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tm *ptVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  ptVar3 = localtime(time);
  auVar5._0_4_ = ptVar3->tm_sec;
  auVar5._4_4_ = ptVar3->tm_min;
  auVar5._8_4_ = ptVar3->tm_hour;
  auVar5._12_4_ = ptVar3->tm_mday;
  auVar5 = pshufb(auVar5,_DAT_00106250);
  uVar4 = auVar5._0_8_;
  sce->day = (short)uVar4;
  sce->hour = (short)((ulong)uVar4 >> 0x10);
  sce->minute = (short)((ulong)uVar4 >> 0x20);
  sce->second = (short)((ulong)uVar4 >> 0x30);
  uVar1 = ptVar3->tm_mon;
  uVar2 = ptVar3->tm_year;
  auVar6._4_4_ = uVar2;
  auVar6._0_4_ = uVar1;
  auVar6._8_8_ = 0;
  auVar5 = pshuflw(auVar6,auVar6,0xe2);
  sce->year = auVar5._0_2_ + 0x76c;
  sce->month = auVar5._2_2_ + 1;
  sce->microsecond = 0;
  return;
}

Assistant:

static void time_to_scetime(const time_t *time, SceDateTime *sce) {
  struct tm *tmp;
  tmp = localtime(time);
  sce->second = htole32(tmp->tm_sec);
  sce->minute = htole32(tmp->tm_min);
  sce->hour = htole32(tmp->tm_hour);
  sce->day = htole32(tmp->tm_mday);
  sce->month = htole32(tmp->tm_mon + 1);
  sce->year = htole32(tmp->tm_year + 1900);
  sce->microsecond = htole32(0);
}